

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall
Environment::Environment
          (Environment *this,
          unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
          *scopes)

{
  unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
  *scopes_local;
  Environment *this_local;
  
  std::
  unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
  ::unordered_map(&this->mScopes,scopes);
  return;
}

Assistant:

Environment::Environment(std::unordered_map<ResultValueType, EnvironmentScope> scopes)
	 : mScopes(scopes) {

}